

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_tests.c
# Opt level: O2

void cjson_compare_should_compare_arrays(void)

{
  cJSON_bool cVar1;
  
  cVar1 = compare_from_string("[]","[]",1);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x8c);
  }
  cVar1 = compare_from_string("[]","[]",0);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x8d);
  }
  cVar1 = compare_from_string("[false,true,null,42,\"string\",[],{}]",
                              "[false, true, null, 42, \"string\", [], {}]",1);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x8f);
  }
  cVar1 = compare_from_string("[false,true,null,42,\"string\",[],{}]",
                              "[false, true, null, 42, \"string\", [], {}]",0);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x90);
  }
  cVar1 = compare_from_string("[[[1], 2]]","[[[1], 2]]",1);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x92);
  }
  cVar1 = compare_from_string("[[[1], 2]]","[[[1], 2]]",0);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x93);
  }
  cVar1 = compare_from_string("[true,null,42,\"string\",[],{}]",
                              "[false, true, null, 42, \"string\", [], {}]",1);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x95);
  }
  cVar1 = compare_from_string("[true,null,42,\"string\",[],{}]",
                              "[false, true, null, 42, \"string\", [], {}]",0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x96);
  }
  cVar1 = compare_from_string("[1,2,3]","[1,2]",1);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x99);
  }
  cVar1 = compare_from_string("[1,2,3]","[1,2]",0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x9a);
    return;
  }
  return;
}

Assistant:

static void cjson_compare_should_compare_arrays(void)
{
    TEST_ASSERT_TRUE(compare_from_string("[]", "[]", true));
    TEST_ASSERT_TRUE(compare_from_string("[]", "[]", false));

    TEST_ASSERT_TRUE(compare_from_string("[false,true,null,42,\"string\",[],{}]", "[false, true, null, 42, \"string\", [], {}]", true));
    TEST_ASSERT_TRUE(compare_from_string("[false,true,null,42,\"string\",[],{}]", "[false, true, null, 42, \"string\", [], {}]", false));

    TEST_ASSERT_TRUE(compare_from_string("[[[1], 2]]", "[[[1], 2]]", true));
    TEST_ASSERT_TRUE(compare_from_string("[[[1], 2]]", "[[[1], 2]]", false));

    TEST_ASSERT_FALSE(compare_from_string("[true,null,42,\"string\",[],{}]", "[false, true, null, 42, \"string\", [], {}]", true));
    TEST_ASSERT_FALSE(compare_from_string("[true,null,42,\"string\",[],{}]", "[false, true, null, 42, \"string\", [], {}]", false));

    /* Arrays that are a prefix of another array */
    TEST_ASSERT_FALSE(compare_from_string("[1,2,3]", "[1,2]", true));
    TEST_ASSERT_FALSE(compare_from_string("[1,2,3]", "[1,2]", false));
}